

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Genetic.cpp
# Opt level: O2

Solution * Genetic::run(int max_iter)

{
  double dVar1;
  Solution *this;
  bool bVar2;
  ostream *poVar3;
  list<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_> *plVar4;
  Solution *pSVar5;
  _List_node_base *p_Var6;
  iterator it;
  list<std::pair<Solution_*,_Solution_*>,_std::allocator<std::pair<Solution_*,_Solution_*>_>_>
  parents;
  value_type local_58;
  _List_node_base local_48;
  
  generate_population();
  std::__cxx11::list<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>
  ::sort<solutions_comparator>(&solutions_abi_cxx11_);
  while (bVar2 = avaliate_population(), bVar2) {
    select_parents_abi_cxx11_();
    p_Var6 = &local_48;
    while (p_Var6 = (((_List_impl *)&p_Var6->_M_next)->_M_node).super__List_node_base._M_next,
          p_Var6 != &local_48) {
      local_58.first = generate_child((Solution *)p_Var6[1]._M_next,(Solution *)p_Var6[1]._M_prev);
      local_58.second = 0.0;
      std::__cxx11::
      list<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>::
      push_back(&solutions_abi_cxx11_,&local_58);
    }
    plVar4 = &solutions_abi_cxx11_;
    max_weight = 0.0;
    while (plVar4 = (list<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>
                     *)(((_List_base<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>
                          *)&((_List_node_base *)plVar4)->_M_next)->_M_impl)._M_node.
                       super__List_node_base._M_next, plVar4 != &solutions_abi_cxx11_) {
      pSVar5 = *(Solution **)((long)plVar4 + 0x10);
      Solution::mutate(pSVar5);
      dVar1 = pSVar5->weight;
      if (max_weight < dVar1) {
        max_weight = dVar1;
      }
    }
    std::__cxx11::
    list<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>::
    sort<solutions_comparator>(&solutions_abi_cxx11_);
    local_58.first =
         (Solution *)
         solutions_abi_cxx11_.
         super__List_base<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    std::advance<std::_List_iterator<std::pair<Solution*,double>>,int>
              ((_List_iterator<std::pair<Solution_*,_double>_> *)&local_58,population_limit);
    for (pSVar5 = local_58.first; pSVar5 != (Solution *)&solutions_abi_cxx11_;
        pSVar5 = (Solution *)
                 (((_List_base<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>
                    *)&pSVar5->vehicles)->_M_impl)._M_node.super__List_node_base._M_next) {
      this = (Solution *)
             (((_List_base<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>
                *)&pSVar5->vehicles)->_M_impl)._M_node._M_size;
      if (this != (Solution *)0x0) {
        Solution::~Solution(this);
      }
      operator_delete(this);
    }
    std::__cxx11::
    list<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>::erase
              (&solutions_abi_cxx11_,(const_iterator)local_58.first,(const_iterator)0x122700);
    std::operator<<((ostream *)&std::cout,"Genetic iteration, best solution: ");
    poVar3 = std::ostream::_M_insert<double>
                       ((double)solutions_abi_cxx11_.
                                super__List_base<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>
                                ._M_impl._M_node.super__List_node_base._M_next[1]._M_next[1]._M_prev
                       );
    std::operator<<(poVar3,"\n");
    std::__cxx11::
    _List_base<std::pair<Solution_*,_Solution_*>,_std::allocator<std::pair<Solution_*,_Solution_*>_>_>
    ::_M_clear((_List_base<std::pair<Solution_*,_Solution_*>,_std::allocator<std::pair<Solution_*,_Solution_*>_>_>
                *)&local_48);
  }
  return (Solution *)
         solutions_abi_cxx11_.
         super__List_base<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>
         ._M_impl._M_node.super__List_node_base._M_next[1]._M_next;
}

Assistant:

Solution* Genetic::run(int max_iter)
{
	generate_population();
	solutions.sort(solutions_comparator());
	while (true || max_iter-- > 0)
	{
		if (!avaliate_population())
		{
			return (*solutions.begin()).first;
		}
		std::list<std::pair<Solution*, Solution*>> parents = select_parents();

		//Generate childs and add to solutions pool
		for (auto parent : parents)
		{
			solutions.push_back(std::pair<Solution*, double>(generate_child(parent.first, parent.second), 0));
		}

		//Mutate solutions
		max_weight = 0;
		for (auto solution : solutions)
		{
			solution.first->mutate();

			if (solution.first->weight > max_weight)
				max_weight = solution.first->weight;
		}


		//Kill the worst		
		solutions.sort(solutions_comparator());
		auto it = solutions.begin();
		std::advance(it, population_limit);

		auto it2 = it;
		for (; it2 != solutions.end(); ++it2)
			delete (*it2).first;

		solutions.erase(it, solutions.end());

		std::cout << "Genetic iteration, best solution: " << (*solutions.begin()).first->weight << "\n";
	}
	return solutions.begin()->first;
}